

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

int __thiscall SPSUnit::deserializeVuiParameters(SPSUnit *this)

{
  bool bVar1;
  uchar uVar2;
  unsigned_short uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int beforeCount_1;
  int beforeCount;
  SPSUnit *this_local;
  
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  this->aspect_ratio_info_present_flag = (uint)bVar1;
  if (this->aspect_ratio_info_present_flag != 0) {
    uVar2 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,8);
    this->aspect_ratio_idc = uVar2;
    if (this->aspect_ratio_idc == 0xff) {
      uVar3 = BitStreamReader::getBits<unsigned_short>(&(this->super_NALUnit).bitReader,0x10);
      this->sar_width = uVar3;
      uVar3 = BitStreamReader::getBits<unsigned_short>(&(this->super_NALUnit).bitReader,0x10);
      this->sar_height = uVar3;
    }
  }
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  if (bVar1) {
    BitStreamReader::skipBit(&(this->super_NALUnit).bitReader);
  }
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  if (bVar1) {
    BitStreamReader::skipBits(&(this->super_NALUnit).bitReader,4);
    bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
    if (bVar1) {
      BitStreamReader::skipBits(&(this->super_NALUnit).bitReader,0x18);
    }
  }
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  if (bVar1) {
    uVar5 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    if (5 < uVar5) {
      return 1;
    }
    uVar5 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    if (5 < uVar5) {
      return 1;
    }
  }
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  this->timing_info_present_flag = (uint)bVar1;
  if (this->timing_info_present_flag != 0) {
    iVar4 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
    this->num_units_in_tick_bit_pos = iVar4;
    uVar5 = BitStreamReader::getBits(&(this->super_NALUnit).bitReader,0x20);
    this->num_units_in_tick = uVar5;
    uVar5 = BitStreamReader::getBits(&(this->super_NALUnit).bitReader,0x20);
    this->time_scale = uVar5;
    bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
    this->fixed_frame_rate_flag = (uint)bVar1;
  }
  iVar4 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
  this->hrdParamsBitPos = iVar4 + 0x20;
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  (this->nalHrdParams).isPresent = bVar1;
  if (((this->nalHrdParams).isPresent & 1U) != 0) {
    iVar4 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
    iVar6 = hrd_parameters(this,&this->nalHrdParams);
    if (iVar6 != 0) {
      return 1;
    }
    iVar6 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
    (this->nalHrdParams).bitLen = iVar6 - iVar4;
  }
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  (this->vclHrdParams).isPresent = bVar1;
  if (((this->vclHrdParams).isPresent & 1U) != 0) {
    iVar4 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
    iVar6 = hrd_parameters(this,&this->vclHrdParams);
    if (iVar6 != 0) {
      return 1;
    }
    iVar6 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
    (this->vclHrdParams).bitLen = iVar6 - iVar4;
  }
  if ((((this->nalHrdParams).isPresent & 1U) != 0) || (((this->vclHrdParams).isPresent & 1U) != 0))
  {
    bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
    this->low_delay_hrd_flag = (uint)bVar1;
  }
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  this->pic_struct_present_flag = (uint)bVar1;
  bVar1 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
  if (bVar1) {
    BitStreamReader::skipBit(&(this->super_NALUnit).bitReader);
    uVar5 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    if (0x10 < uVar5) {
      return 1;
    }
    uVar5 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    if (0x10 < uVar5) {
      return 1;
    }
    uVar5 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    if (0x10 < uVar5) {
      return 1;
    }
    uVar5 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    if (0x10 < uVar5) {
      return 1;
    }
    uVar5 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    uVar7 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
    if (uVar7 < uVar5) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int SPSUnit::deserializeVuiParameters()
{
    aspect_ratio_info_present_flag = bitReader.getBit();
    if (aspect_ratio_info_present_flag)
    {
        aspect_ratio_idc = bitReader.getBits<uint8_t>(8);
        if (aspect_ratio_idc == Extended_SAR)
        {
            sar_width = bitReader.getBits<uint16_t>(16);
            sar_height = bitReader.getBits<uint16_t>(16);
        }
    }
    if (bitReader.getBit())   // overscan_info_present_flag
        bitReader.skipBit();  // overscan_appropriate_flag
    if (bitReader.getBit())   // video_signal_type_present_flag
    {
        bitReader.skipBits(4);       // video_format, video_full_range_flag
        if (bitReader.getBit())      // colour_description_present_flag
            bitReader.skipBits(24);  // colour_primaries, transfer_characteristics, matrix_coefficients
    }
    if (bitReader.getBit())  // chroma_loc_info_present_flag
    {
        if (extractUEGolombCode() > 5)  // chroma_sample_loc_type_top_field
            return 1;
        if (extractUEGolombCode() > 5)  // chroma_sample_loc_type_bottom_field
            return 1;
    }
    timing_info_present_flag = bitReader.getBit();
    if (timing_info_present_flag)
    {
        num_units_in_tick_bit_pos = bitReader.getBitsCount();
        num_units_in_tick = bitReader.getBits(32);
        time_scale = bitReader.getBits(32);
        fixed_frame_rate_flag = bitReader.getBit();
    }
    hrdParamsBitPos = bitReader.getBitsCount() + 32;

    // orig_hrd_parameters_present_flag =
    nalHrdParams.isPresent = bitReader.getBit();
    if (nalHrdParams.isPresent)
    {
        const int beforeCount = bitReader.getBitsCount();
        if (hrd_parameters(nalHrdParams) != 0)
            return 1;
        nalHrdParams.bitLen = bitReader.getBitsCount() - beforeCount;
    }

    vclHrdParams.isPresent = bitReader.getBit();
    if (vclHrdParams.isPresent)
    {
        const int beforeCount = bitReader.getBitsCount();
        if (hrd_parameters(vclHrdParams) != 0)
            return 1;
        vclHrdParams.bitLen = bitReader.getBitsCount() - beforeCount;
    }
    if (nalHrdParams.isPresent || vclHrdParams.isPresent)
        low_delay_hrd_flag = bitReader.getBit();
    pic_struct_present_flag = bitReader.getBit();
    if (bitReader.getBit())  // bitstream_restriction_flag
    {
        bitReader.skipBit();             // motion_vectors_over_pic_boundaries_flag
        if (extractUEGolombCode() > 16)  // max_bytes_per_pic_denom
            return 1;
        if (extractUEGolombCode() > 16)  // max_bits_per_mb_denom
            return 1;
        if (extractUEGolombCode() > 16)  // log2_max_mv_length_horizontal
            return 1;
        if (extractUEGolombCode() > 16)  // log2_max_mv_length_vertical
            return 1;
        if (extractUEGolombCode() > extractUEGolombCode())  // num_reorder_frames > max_dec_frame_buffering
            return 1;
    }
    return 0;
}